

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowpassSpeaker.hpp
# Opt level: O1

void __thiscall
Outputs::Speaker::LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>::
update_filter_coefficients
          (LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false> *this,
          FilterParameters *filter_parameters)

{
  ulong __new_size;
  float fVar1;
  float fVar2;
  FIRFilter *__ptr;
  Conversion CVar3;
  FIRFilter *this_00;
  pointer __p;
  ulong uVar4;
  size_t required_buffer_size;
  float fVar5;
  float fVar6;
  float fVar7;
  FIRFilter *local_40;
  ulong local_38;
  undefined8 uStack_30;
  
  fVar1 = filter_parameters->input_cycles_per_second;
  fVar2 = filter_parameters->output_cycles_per_second;
  fVar5 = fVar2 * 0.5;
  fVar6 = filter_parameters->high_frequency_cutoff;
  fVar7 = fVar5;
  if (fVar6 <= fVar5) {
    fVar7 = fVar6;
  }
  fVar6 = (float)(~-(uint)(0.0 < fVar6) & (uint)fVar5 | (uint)fVar7 & -(uint)(0.0 < fVar6));
  local_38 = (ulong)(uint)fVar6;
  uStack_30 = 0;
  fVar6 = ceilf((fVar1 + fVar6) / fVar6);
  uVar4 = (long)(fVar6 - 9.223372e+18) & (long)fVar6 >> 0x3f | (long)fVar6;
  __new_size = uVar4 * 2 + 1;
  this->step_rate_ = fVar1 / fVar2;
  this->position_error_ = 0.0;
  this_00 = (FIRFilter *)operator_new(0x18);
  SignalProcessing::FIRFilter::FIRFilter
            (this_00,__new_size & 0xffffffff,filter_parameters->input_cycles_per_second,0.0,
             (float)local_38,60.0);
  local_40 = (FIRFilter *)0x0;
  __ptr = (this->filter_)._M_t.
          super___uniq_ptr_impl<SignalProcessing::FIRFilter,_std::default_delete<SignalProcessing::FIRFilter>_>
          ._M_t.
          super__Tuple_impl<0UL,_SignalProcessing::FIRFilter_*,_std::default_delete<SignalProcessing::FIRFilter>_>
          .super__Head_base<0UL,_SignalProcessing::FIRFilter_*,_false>._M_head_impl;
  (this->filter_)._M_t.
  super___uniq_ptr_impl<SignalProcessing::FIRFilter,_std::default_delete<SignalProcessing::FIRFilter>_>
  ._M_t.
  super__Tuple_impl<0UL,_SignalProcessing::FIRFilter_*,_std::default_delete<SignalProcessing::FIRFilter>_>
  .super__Head_base<0UL,_SignalProcessing::FIRFilter_*,_false>._M_head_impl = this_00;
  if (__ptr != (FIRFilter *)0x0) {
    std::default_delete<SignalProcessing::FIRFilter>::operator()
              ((default_delete<SignalProcessing::FIRFilter> *)&this->filter_,__ptr);
  }
  if (local_40 != (FIRFilter *)0x0) {
    std::default_delete<SignalProcessing::FIRFilter>::operator()
              ((default_delete<SignalProcessing::FIRFilter> *)&local_40,local_40);
  }
  fVar1 = filter_parameters->input_cycles_per_second;
  fVar2 = filter_parameters->output_cycles_per_second;
  if ((((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) ||
      (CVar3 = Copy, 0.0 <= filter_parameters->high_frequency_cutoff)) &&
     (CVar3 = ResampleSmaller, fVar1 <= fVar2)) {
    CVar3 = (-(uint)(filter_parameters->high_frequency_cutoff < 0.0 || fVar1 != fVar2) & 1) * 2;
  }
  this->conversion_ = CVar3;
  if ((CVar3 == ResampleSmaller) &&
     ((long)(this->input_buffer_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->input_buffer_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
            super__Vector_impl_data._M_start >> 1 != __new_size)) {
    if (uVar4 * 2 < this->input_buffer_depth_) {
      resample_input_buffer(this,0x10000);
      this->input_buffer_depth_ = this->input_buffer_depth_ % __new_size;
    }
    std::vector<short,_std::allocator<short>_>::resize(&this->input_buffer_,__new_size);
  }
  return;
}

Assistant:

void update_filter_coefficients(const FilterParameters &filter_parameters) {
			float high_pass_frequency = filter_parameters.output_cycles_per_second / 2.0f;
			if(filter_parameters.high_frequency_cutoff > 0.0) {
				high_pass_frequency = std::min(filter_parameters.high_frequency_cutoff, high_pass_frequency);
			}

			// Make a guess at a good number of taps.
			std::size_t number_of_taps = std::size_t(
				ceilf((filter_parameters.input_cycles_per_second + high_pass_frequency) / high_pass_frequency)
			);
			number_of_taps = (number_of_taps * 2) | 1;

			step_rate_ = filter_parameters.input_cycles_per_second / filter_parameters.output_cycles_per_second;
			position_error_ = 0.0f;

			filter_ = std::make_unique<SignalProcessing::FIRFilter>(
				unsigned(number_of_taps),
				filter_parameters.input_cycles_per_second,
				0.0,
				high_pass_frequency,
				SignalProcessing::FIRFilter::DefaultAttenuation);

			// Pick the new conversion function.
			if(	filter_parameters.input_cycles_per_second == filter_parameters.output_cycles_per_second &&
				filter_parameters.high_frequency_cutoff < 0.0) {
				// If input and output rates exactly match, and no additional cut-off has been specified,
				// just accumulate results and pass on.
				conversion_ = Conversion::Copy;
			} else if(	filter_parameters.input_cycles_per_second > filter_parameters.output_cycles_per_second ||
				(filter_parameters.input_cycles_per_second == filter_parameters.output_cycles_per_second && filter_parameters.high_frequency_cutoff >= 0.0)) {
				// If the output rate is less than the input rate, or an additional cut-off has been specified, use the filter.
				conversion_ = Conversion::ResampleSmaller;
			} else {
				conversion_ = Conversion::ResampleLarger;
			}

			// Do something sensible with any dangling input, if necessary.
			const int scale = static_cast<ConcreteT *>(this)->get_scale();
			switch(conversion_) {
				// Neither direct copying nor resampling larger currently use any temporary input.
				// Although in the latter case that's just because it's unimplemented. But, regardless,
				// that means nothing to do.
				default: break;

				case Conversion::ResampleSmaller: {
					// Reize the input buffer only if absolutely necessary; if sizing downward
					// such that a sample would otherwise be lost then output it now. Keep anything
					// currently in the input buffer that hasn't yet been processed.
					const size_t required_buffer_size = size_t(number_of_taps) * (is_stereo + 1);
					if(input_buffer_.size() != required_buffer_size) {
						if(input_buffer_depth_ >= required_buffer_size) {
							resample_input_buffer(scale);
							input_buffer_depth_ %= required_buffer_size;
						}
						input_buffer_.resize(required_buffer_size);
					}
				} break;
			}
		}